

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

ResolveResult * __thiscall
capnp::compiler::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  uint64_t uVar1;
  bool bVar2;
  ResolvedDecl *pRVar3;
  Type local_48 [2];
  undefined1 local_21;
  uint64_t local_20;
  uint64_t scopeId_local;
  BrandedDecl *this_local;
  ResolveResult *result;
  
  local_21 = 0;
  local_20 = scopeId;
  scopeId_local = (uint64_t)this;
  this_local = (BrandedDecl *)__return_storage_ptr__;
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  OneOf(__return_storage_ptr__,&this->body);
  bVar2 = kj::
          OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          ::is<capnp::compiler::Resolver::ResolvedDecl>(__return_storage_ptr__);
  uVar1 = local_20;
  if (bVar2) {
    pRVar3 = kj::
             OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
             ::get<capnp::compiler::Resolver::ResolvedDecl>(__return_storage_ptr__);
    pRVar3->scopeId = uVar1;
    local_48[0].result = __return_storage_ptr__;
    local_48[0].brandBuilder = &brandBuilder;
    getIdAndFillBrand<capnp::compiler::BrandedDecl::asResolveResult(unsigned_long,capnp::schema::Brand::Builder)::__0>
              (this,local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Resolver::ResolveResult BrandedDecl::asResolveResult(
    uint64_t scopeId, schema::Brand::Builder brandBuilder) {
  auto result = body;
  if (result.is<Resolver::ResolvedDecl>()) {
    // May need to compile our context as the "brand".

    result.get<Resolver::ResolvedDecl>().scopeId = scopeId;

    getIdAndFillBrand([&]() {
      result.get<Resolver::ResolvedDecl>().brand = brandBuilder.asReader();
      return brandBuilder;
    });
  }
  return result;
}